

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variables.cpp
# Opt level: O0

bool __thiscall
Refal2::CVariables::Get(CVariables *this,TVariableIndex variableIndex,TTableIndex *tableIndex)

{
  CVariable *pCVar1;
  bool bVar2;
  CVariable *variable;
  TTableIndex *tableIndex_local;
  TVariableIndex variableIndex_local;
  CVariables *this_local;
  
  bVar2 = IsValidVariableIndex(this,variableIndex);
  if (!bVar2) {
    __assert_fail("IsValidVariableIndex( variableIndex )",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Variables.cpp"
                  ,0x3f,"bool Refal2::CVariables::Get(TVariableIndex, TTableIndex &)");
  }
  if (this->variablesValues != (TTableIndex *)0x0) {
    pCVar1 = this->variables;
    bVar2 = pCVar1[variableIndex].position <= pCVar1[variableIndex].originPosition;
    if (bVar2) {
      *tableIndex = this->variablesValues[pCVar1[variableIndex].position];
    }
    else {
      pCVar1[variableIndex].position = pCVar1[variableIndex].position + -1;
      *tableIndex = this->variablesValues[pCVar1[variableIndex].position];
    }
    this_local._7_1_ = !bVar2;
    return this_local._7_1_;
  }
  __assert_fail("variablesValues != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Variables.cpp"
                ,0x40,"bool Refal2::CVariables::Get(TVariableIndex, TTableIndex &)");
}

Assistant:

bool CVariables::Get( TVariableIndex variableIndex, TTableIndex& tableIndex)
{
	assert( IsValidVariableIndex( variableIndex ) );
	assert( variablesValues != 0 );
	CVariable& variable = variables[variableIndex];
	if( variable.position > variable.originPosition ) {
		variable.position--;
		tableIndex = variablesValues[variable.position];
		return true;
	} else /* var.position == var.originPosition */ {
		tableIndex = variablesValues[variable.position];
		return false;
	}
}